

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::end
          (QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *this)

{
  pair<QModelIndex,_QPersistentModelIndex> *n;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x8ab609);
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::operator->(in_RDI);
  n = QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::end
                (in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }